

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O2

void backTrace(object *aContext)

{
  object *poVar1;
  ulong uVar2;
  object *poVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  int iStack_40;
  
  puts("back trace");
  if ((aContext == (object *)0x0) || (nilObject == aContext)) {
    pcVar5 = "   Cannot dump context, point is NULL or points to the nil object!";
    iStack_40 = 0x46;
  }
  else {
    iVar4 = isDynamicMemory(aContext);
    if (iVar4 != 0) {
      do {
        if ((aContext == (object *)0x0) || (aContext == nilObject)) {
          return;
        }
        poVar1 = (object *)aContext[1].header;
        if (poVar1 == nilObject || poVar1 == (object *)0x0) {
          pcVar5 = " nil method ";
LAB_001058b3:
          printf(pcVar5);
        }
        else {
          poVar3 = poVar1[3].class;
          if (poVar3 == nilObject || poVar3 == (object *)0x0) {
            pcVar5 = "nil class";
LAB_00105865:
            printf(pcVar5);
          }
          else {
            poVar3 = (object *)poVar3[1].header;
            if (poVar3 == nilObject || poVar3 == (object *)0x0) {
              pcVar5 = "nil class name";
              goto LAB_00105865;
            }
            printf("class %.*s",(ulong)((uint)poVar3->header >> 2),poVar3 + 1);
          }
          poVar1 = (object *)poVar1[1].header;
          if ((poVar1 == (object *)0x0) || (poVar1 == nilObject)) {
            pcVar5 = " nil symbol ";
            goto LAB_001058b3;
          }
          printf(" #%.*s ",(ulong)((uint)poVar1->header >> 2),poVar1 + 1);
        }
        poVar1 = aContext[1].class;
        if ((poVar1 != (object *)0x0) && (poVar1 != nilObject)) {
          putchar(0x28);
          for (uVar6 = 0; uVar6 < (uint)poVar1->header >> 2; uVar6 = uVar6 + 1) {
            if (uVar6 != 0) {
              printf(", ");
            }
            uVar2 = (&poVar1[1].header)[uVar6];
            if (uVar2 == 0) {
              pcVar5 = "nil arg";
LAB_00105957:
              printf(pcVar5);
            }
            else {
              if ((uVar2 & 1) == 0) {
                poVar3 = *(object **)(uVar2 + 8);
                if ((poVar3 == (object *)0x0) || (poVar3 == nilObject)) {
                  pcVar5 = "nil class";
                }
                else {
                  poVar3 = (object *)poVar3[1].header;
                  if (poVar3 != nilObject && poVar3 != (object *)0x0) {
                    printf("%.*s",(ulong)((uint)poVar3->header >> 2),poVar3 + 1);
                    goto LAB_0010595e;
                  }
                  pcVar5 = "nil class name";
                }
                goto LAB_00105957;
              }
              printf("%d",uVar2 >> 1);
            }
LAB_0010595e:
          }
          putchar(0x29);
        }
        putchar(10);
        aContext = (object *)aContext[4].header;
      } while( true );
    }
    pcVar5 = "  Cannot dump context, pointer is not to a live object!";
    iStack_40 = 0x3d;
  }
  info_impl("backTrace",iStack_40,pcVar5);
  return;
}

Assistant:

void backTrace(struct object * aContext)
{
    printf("back trace\n");

    /* check if we actually got a Context. */
    if(NOT_NIL(aContext)) {
        if(! isDynamicMemory(aContext)) {
            info("  Cannot dump context, pointer is not to a live object!");
            return;

            if(aContext->class != ContextClass) {
                info("  Cannot dump context, pointer is not to a Context object!");
                return;
            }
        }
    } else {
        info("   Cannot dump context, point is NULL or points to the nil object!");
        return;
    }

    while (NOT_NIL(aContext)) {
        struct object *method = aContext->data[methodInContext];
        struct object *class;
        struct object *symbol;
        struct object *arguments;
        int i;

        if(NOT_NIL(method)) {
            class = method->data[classInMethod];

            if(NOT_NIL(class)) {
                symbol = class->data[nameInClass];

                if(NOT_NIL(symbol)) {
                    printf("class %.*s", SIZE(symbol), bytePtr(symbol));
                } else {
                    printf("nil class name");
                }
            } else {
                printf("nil class");
            }

            symbol = method->data[nameInMethod];
            if(NOT_NIL(symbol)) {
                printf(" #%.*s ", SIZE(symbol), bytePtr(symbol));
            } else {
                printf(" nil symbol ");
            }
        } else {
            printf(" nil method ");
        }

        arguments = aContext->data[argumentsInContext];
        if (NOT_NIL(arguments)) {
            printf("(");
            for (i = 0; i < (int)SIZE(arguments); i++) {
                if(i > 0) { printf(", "); }
                if(arguments->data[i]) {
                    struct object *arg = arguments->data[i];

                    if(IS_SMALLINT(arg)) {
                        printf("%d", integerValue(arg));
                    } else {
                        class = CLASS(arg);

                        if(NOT_NIL(class)) {
                            symbol = class->data[nameInClass];

                            if(NOT_NIL(symbol)) {
                                printf("%.*s", SIZE(symbol), bytePtr(symbol));
                            } else {
                                printf("nil class name");
                            }
                        } else {
                            printf("nil class");
                        }
                    }
                } else {
                    printf("nil arg");
                }
            }

            printf(")");
        }
        printf("\n");

        aContext = aContext->data[previousContextInContext];
    }
}